

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O1

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (ConditionalExpression *this,MonitorVisitor *visitor)

{
  size_type sVar1;
  pointer pCVar2;
  Expression *this_00;
  long lVar3;
  
  sVar1 = (this->conditions).size_;
  if (sVar1 != 0) {
    pCVar2 = (this->conditions).data_;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)&(pCVar2->expr).ptr + lVar3);
      if (this_00 == (Expression *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
                  );
      }
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 0x10;
    } while (sVar1 << 4 != lVar3);
  }
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions)
            cond.expr->visit(visitor);

        left().visit(visitor);
        right().visit(visitor);
    }